

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.h
# Opt level: O3

int bitset_container_get_index(bitset_container_t *container,uint16_t x)

{
  uint64_t *puVar1;
  ulong uVar2;
  int iVar3;
  undefined6 in_register_00000032;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  puVar1 = container->words;
  uVar7 = CONCAT62(in_register_00000032,x) >> 6 & 0x3ffffff;
  if ((puVar1[uVar7] >> ((ulong)x & 0x3f) & 1) != 0) {
    uVar6 = 0;
    if (x < 0x40) {
      iVar3 = -1;
      uVar7 = uVar6;
    }
    else {
      uVar4 = 0;
      do {
        uVar2 = puVar1[uVar4] - (puVar1[uVar4] >> 1 & 0x5555555555555555);
        uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
        uVar5 = (int)uVar6 +
                (uint)(byte)(((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)
        ;
        uVar6 = (ulong)uVar5;
        uVar4 = uVar4 + 1;
      } while (uVar7 != uVar4);
      iVar3 = uVar5 - 1;
    }
    uVar7 = (2L << ((byte)x & 0x3f)) - 1U & puVar1[uVar7];
    uVar7 = uVar7 - (uVar7 >> 1 & 0x5555555555555555);
    uVar7 = (uVar7 >> 2 & 0x3333333333333333) + (uVar7 & 0x3333333333333333);
    return (uint)(byte)(((uVar7 >> 4) + uVar7 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) +
           iVar3;
  }
  return -1;
}

Assistant:

inline bool bitset_container_get(const bitset_container_t *bitset,
                                 uint16_t pos) {
    const uint64_t word = bitset->words[pos >> 6];
    return (word >> (pos & 63)) & 1;
}